

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

int SUNHashMap_Iterate(SUNHashMap map,int start,_func_int_int_SUNHashMapKeyValue_void_ptr *yieldfn,
                      void *ctx)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -2;
  if ((yieldfn != (_func_int_int_SUNHashMapKeyValue_void_ptr *)0x0 && map != (SUNHashMap)0x0) &&
     (iVar1 = map->max_size, start < iVar1)) {
    lVar2 = (long)start;
    do {
      iVar1 = (*yieldfn)((int)lVar2,map->buckets[lVar2],ctx);
      if (iVar1 != -1) {
        return iVar1;
      }
      lVar2 = lVar2 + 1;
      iVar1 = map->max_size;
    } while (lVar2 < iVar1);
  }
  return iVar1;
}

Assistant:

int SUNHashMap_Iterate(SUNHashMap map, int start,
                       int (*yieldfn)(int, SUNHashMapKeyValue, const void*),
                       const void* ctx)
{
  int i;

  if (map == NULL || yieldfn == NULL) { return (-2); }

  for (i = start; i < map->max_size; i++)
  {
    int retval = yieldfn(i, map->buckets[i], ctx);
    if (retval >= 0)
    {
      return (retval); /* yieldfn indicates the loop should break */
    }
    if (retval < -1) { return (retval); /* error occurred */ }
  }

  return (map->max_size);
}